

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::handleExceptionMatchExpr(AssertionHandler *handler,string *str)

{
  StringMatcherBase local_70;
  
  Matchers::Equals((StringEqualsMatcher *)&local_70,str,Yes);
  handleExceptionMatchExpr
            (handler,&local_70.
                      super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  Matchers::StringMatcherBase::~StringMatcherBase(&local_70);
  return;
}

Assistant:

void handleExceptionMatchExpr( AssertionHandler& handler, std::string const& str ) {
        handleExceptionMatchExpr( handler, Matchers::Equals( str ) );
    }